

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyCurrentVertexAttribIui
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLuint x,GLuint y,GLuint z,
               GLuint w)

{
  GLuint index_00;
  CallLogWrapper *this;
  qpTestResult qVar1;
  uint (*pauVar2) [4];
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1d8;
  undefined1 local_58 [8];
  StateQueryMemoryWriteGuard<unsigned_int[4]> attribValue;
  GLuint z_local;
  GLuint y_local;
  GLuint x_local;
  GLint index_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  attribValue.m_postguard[2] = z;
  attribValue.m_postguard[3] = y;
  z_local = x;
  y_local = index;
  _x_local = gl;
  gl_local = (CallLogWrapper *)testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)local_58);
  this = _x_local;
  index_00 = y_local;
  pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_58);
  glu::CallLogWrapper::glGetVertexAttribIuiv(this,index_00,0x8626,*pauVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[4]>::verifyValidity
            ((StateQueryMemoryWriteGuard<unsigned_int[4]> *)local_58,(TestContext *)gl_local);
  pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_58);
  if (((((*pauVar2)[0] != z_local) ||
       (pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
       (*pauVar2)[1] != attribValue.m_postguard[3])) ||
      (pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
      (*pauVar2)[2] != attribValue.m_postguard[2])) ||
     (pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
     (*pauVar2)[3] != w)) {
    this_00 = tcu::TestContext::getLog((TestContext *)gl_local);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [21])"// ERROR: Expected [");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&z_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,attribValue.m_postguard + 3);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,attribValue.m_postguard + 2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&w);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2c3759d);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [6])0x2b89e13);
    pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pauVar2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
    pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pauVar2 + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
    pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pauVar2 + 2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
    pauVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pauVar2 + 3);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)gl_local);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"got invalid attribute value");
    }
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribIui (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLuint x, GLuint y, GLuint z, GLuint w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLuint[4]> attribValue;
	gl.glGetVertexAttribIuiv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	if (attribValue[0] != x || attribValue[1] != y || attribValue[2] != z || attribValue[3] != w)
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: Expected [" << x << "," << y << "," << z << "," << w << "];"
			<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
			<< TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
	}
}